

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O1

REF_STATUS ref_dict_store(REF_DICT ref_dict,REF_INT key,REF_INT value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_INT *pRVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  
  if (ref_dict->max == ref_dict->n) {
    ref_dict->max = ref_dict->max + 1000;
    fflush(_stdout);
    if (0 < (long)ref_dict->max) {
      pRVar5 = (REF_INT *)realloc(ref_dict->key,(long)ref_dict->max << 2);
      ref_dict->key = pRVar5;
    }
    if (ref_dict->key == (REF_INT *)0x0) {
      pcVar9 = "realloc ref_dict->key NULL";
      uVar7 = 0x52;
    }
    else {
      fflush(_stdout);
      if (0 < (long)ref_dict->max) {
        pRVar5 = (REF_INT *)realloc(ref_dict->value,(long)ref_dict->max << 2);
        ref_dict->value = pRVar5;
      }
      if (ref_dict->value != (REF_INT *)0x0) goto LAB_0010e0f6;
      pcVar9 = "realloc ref_dict->value NULL";
      uVar7 = 0x53;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uVar7,
           "ref_dict_store",pcVar9);
    uVar1 = ref_dict->max;
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar1,(long)(int)uVar1,
           4,(long)(int)uVar1 * 4);
    RVar4 = 2;
  }
  else {
LAB_0010e0f6:
    uVar1 = ref_dict->n;
    uVar8 = (ulong)uVar1;
    lVar6 = (long)(int)uVar1;
    uVar2 = uVar1;
    do {
      uVar3 = uVar2;
      uVar8 = uVar8 - 1;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
        break;
      }
      if (ref_dict->key[uVar8] == key) {
        ref_dict->value[uVar8] = value;
        goto LAB_0010e176;
      }
      uVar2 = uVar3 - 1;
    } while (key <= ref_dict->key[uVar8]);
    if ((int)uVar3 < (int)uVar1) {
      pRVar5 = ref_dict->key;
      do {
        pRVar5[lVar6] = pRVar5[lVar6 + -1];
        lVar6 = lVar6 + -1;
      } while ((int)uVar3 < lVar6);
    }
    lVar6 = (long)ref_dict->n;
    if ((int)uVar3 < ref_dict->n) {
      pRVar5 = ref_dict->value;
      do {
        pRVar5[lVar6] = pRVar5[lVar6 + -1];
        lVar6 = lVar6 + -1;
      } while ((int)uVar3 < lVar6);
    }
    ref_dict->n = ref_dict->n + 1;
    ref_dict->key[uVar3] = key;
    ref_dict->value[uVar3] = value;
LAB_0010e176:
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_dict_store(REF_DICT ref_dict, REF_INT key,
                                  REF_INT value) {
  REF_INT i, insert_point;

  if (ref_dict_max(ref_dict) == ref_dict_n(ref_dict)) {
    ref_dict_max(ref_dict) += 1000;

    ref_realloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
    ref_realloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);
  }

  insert_point = 0;
  for (i = ref_dict_n(ref_dict) - 1; i >= 0; i--) {
    if (ref_dict->key[i] == key) {
      ref_dict->value[i] = value;
      return REF_SUCCESS;
    }
    if (ref_dict->key[i] < key) {
      insert_point = i + 1;
      break;
    }
  }
  /* shift to open up insert_point */
  for (i = ref_dict_n(ref_dict); i > insert_point; i--)
    ref_dict->key[i] = ref_dict->key[i - 1];
  for (i = ref_dict_n(ref_dict); i > insert_point; i--)
    ref_dict->value[i] = ref_dict->value[i - 1];

  /* fill insert_point */
  ref_dict_n(ref_dict)++;
  ref_dict->key[insert_point] = key;
  ref_dict->value[insert_point] = value;

  return REF_SUCCESS;
}